

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

int sync_update(sync_device *d,int row,sync_cb *cb,void *cb_param)

{
  uint __i;
  int iVar1;
  int iVar2;
  long lVar3;
  _func_void_void_ptr_int *p_Var4;
  int flags;
  uint uVar5;
  uchar cmd;
  uchar flag;
  byte local_e5;
  anon_union_4_2_947300a4 v;
  void *local_e0;
  uint local_d4;
  uint32_t new_row;
  uint32_t row_1;
  timeval to;
  fd_set fds;
  
  iVar1 = d->sock;
  if (iVar1 == -1) {
    return -1;
  }
  local_e0 = cb_param;
  local_d4 = row;
  while( true ) {
    to.tv_sec = 0;
    to.tv_usec = 0;
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      fds.__fds_bits[lVar3] = 0;
    }
    fds.__fds_bits[iVar1 / 0x40] = fds.__fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
    flags = 0;
    iVar1 = select(iVar1 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&to);
    if (iVar1 < 1) break;
    cmd = '\0';
    iVar1 = xrecv(d->sock,&cmd,1,flags);
    if (iVar1 != 0) goto LAB_0018eb5e;
    switch(cmd) {
    case '\0':
      iVar1 = d->sock;
      iVar2 = xrecv(iVar1,(timeval *)&to,4,flags);
      if ((((iVar2 == 0) && (iVar2 = xrecv(iVar1,&row_1,4,flags), iVar2 == 0)) &&
          (iVar2 = xrecv(iVar1,&v,4,flags), iVar2 == 0)) &&
         (iVar1 = xrecv(iVar1,&local_e5,1,flags), iVar1 == 0)) {
        uVar5 = (uint)to.tv_sec >> 0x18 | ((uint)to.tv_sec & 0xff0000) >> 8 |
                ((uint)to.tv_sec & 0xff00) << 8 | (uint)to.tv_sec << 0x18;
        to.tv_sec = CONCAT44(to.tv_sec._4_4_,uVar5);
        v.i = v.i >> 0x18 | (v.i & 0xff0000) >> 8 | (v.i & 0xff00) << 8 | v.i << 0x18;
        fds.__fds_bits[0]._0_4_ =
             row_1 >> 0x18 | (row_1 & 0xff0000) >> 8 | (row_1 & 0xff00) << 8 | row_1 << 0x18;
        fds.__fds_bits[0]._4_4_ = v.i;
        if ((local_e5 < 4) && ((ulong)uVar5 < d->num_tracks)) {
          fds.__fds_bits[1]._0_4_ = (uint)local_e5;
          iVar1 = sync_set_key(d->tracks[uVar5],(track_key *)&fds);
          goto LAB_0018ea67;
        }
      }
      goto LAB_0018eb5e;
    case '\x01':
      iVar1 = d->sock;
      iVar2 = xrecv(iVar1,&fds,4,flags);
      if ((iVar2 != 0) || (iVar1 = xrecv(iVar1,(timeval *)&to,4,flags), iVar1 != 0))
      goto LAB_0018eb5e;
      fds.__fds_bits[0]._0_4_ =
           (uint)fds.__fds_bits[0] >> 0x18 | ((uint)fds.__fds_bits[0] & 0xff0000) >> 8 |
           ((uint)fds.__fds_bits[0] & 0xff00) << 8 | (uint)fds.__fds_bits[0] << 0x18;
      uVar5 = (uint)to.tv_sec >> 0x18 | ((uint)to.tv_sec & 0xff0000) >> 8 |
              ((uint)to.tv_sec & 0xff00) << 8 | (uint)to.tv_sec << 0x18;
      to.tv_sec = CONCAT44(to.tv_sec._4_4_,uVar5);
      if (d->num_tracks <= (ulong)(uint)fds.__fds_bits[0]) goto LAB_0018eb5e;
      iVar1 = sync_del_key(d->tracks[(uint)fds.__fds_bits[0]],uVar5);
LAB_0018ea67:
      if (iVar1 != 0) goto LAB_0018eb5e;
      break;
    default:
      fprintf(_stderr,"unknown cmd: %02x\n");
      goto LAB_0018eb5e;
    case '\x03':
      iVar1 = xrecv(d->sock,&new_row,4,flags);
      if (iVar1 != 0) goto LAB_0018eb5e;
      if ((cb != (sync_cb *)0x0) && (p_Var4 = cb->set_row, p_Var4 != (_func_void_void_ptr_int *)0x0)
         ) {
        uVar5 = new_row >> 0x18 | (new_row & 0xff0000) >> 8 | (new_row & 0xff00) << 8 |
                new_row << 0x18;
LAB_0018ead0:
        (*p_Var4)(local_e0,uVar5);
      }
      break;
    case '\x04':
      iVar1 = xrecv(d->sock,&flag,1,flags);
      if (iVar1 != 0) goto LAB_0018eb5e;
      if ((cb != (sync_cb *)0x0) && (p_Var4 = cb->pause, p_Var4 != (_func_void_void_ptr_int *)0x0))
      {
        uVar5 = (uint)flag;
        goto LAB_0018ead0;
      }
      break;
    case '\x05':
      sync_save_tracks(d);
    }
    iVar1 = d->sock;
  }
  if ((((cb != (sync_cb *)0x0) && (cb->is_playing != (_func_int_void_ptr *)0x0)) &&
      (iVar1 = (*cb->is_playing)(local_e0), uVar5 = local_d4, iVar1 != 0)) &&
     ((d->row != local_d4 && (d->sock != -1)))) {
    to.tv_sec = CONCAT71(to.tv_sec._1_7_,3);
    fds.__fds_bits[0]._0_4_ =
         local_d4 >> 0x18 | (local_d4 & 0xff0000) >> 8 | (local_d4 & 0xff00) << 8 | local_d4 << 0x18
    ;
    iVar1 = xsend(d->sock,&to,1,flags);
    if ((iVar1 != 0) || (iVar1 = xsend(d->sock,&fds,4,flags), iVar1 != 0)) {
LAB_0018eb5e:
      close(d->sock);
      d->sock = -1;
      return -1;
    }
    d->row = uVar5;
  }
  return 0;
}

Assistant:

int sync_update(struct sync_device *d, int row, struct sync_cb *cb,
    void *cb_param)
{
	if (d->sock == INVALID_SOCKET)
		return -1;

	/* look for new commands */
	while (socket_poll(d->sock)) {
		unsigned char cmd = 0, flag;
		uint32_t new_row;
		if (xrecv(d->sock, (char *)&cmd, 1, 0))
			goto sockerr;

		switch (cmd) {
		case SET_KEY:
			if (handle_set_key_cmd(d->sock, d))
				goto sockerr;
			break;
		case DELETE_KEY:
			if (handle_del_key_cmd(d->sock, d))
				goto sockerr;
			break;
		case SET_ROW:
			if (xrecv(d->sock, (char *)&new_row, sizeof(new_row), 0))
				goto sockerr;
			if (cb && cb->set_row)
				cb->set_row(cb_param, ntohl(new_row));
			break;
		case PAUSE:
			if (xrecv(d->sock, (char *)&flag, 1, 0))
				goto sockerr;
			if (cb && cb->pause)
				cb->pause(cb_param, flag);
			break;
		case SAVE_TRACKS:
			sync_save_tracks(d);
			break;
		default:
			fprintf(stderr, "unknown cmd: %02x\n", cmd);
			goto sockerr;
		}
	}

	if (cb && cb->is_playing && cb->is_playing(cb_param)) {
		if (d->row != row && d->sock != INVALID_SOCKET) {
			unsigned char cmd = SET_ROW;
			uint32_t nrow = htonl(row);
			if (xsend(d->sock, (char*)&cmd, 1, 0) ||
			    xsend(d->sock, (char*)&nrow, sizeof(nrow), 0))
				goto sockerr;
			d->row = row;
		}
	}
	return 0;

sockerr:
	closesocket(d->sock);
	d->sock = INVALID_SOCKET;
	return -1;
}